

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_verify_hash(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
               uint8_t *signature,size_t signature_length)

{
  psa_key_slot_t *ppStack_40;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t signature_length_local;
  uint8_t *signature_local;
  size_t hash_length_local;
  uint8_t *hash_local;
  psa_key_handle_t local_e;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  
  slot = (psa_key_slot_t *)signature_length;
  signature_length_local = (size_t)signature;
  signature_local = (uint8_t *)hash_length;
  hash_length_local = (size_t)hash;
  hash_local._4_4_ = alg;
  local_e = handle;
  alg_local = psa_get_key_from_slot(handle,&stack0xffffffffffffffc0,0x800,alg);
  if (alg_local == 0) {
    if (((ppStack_40->attr).type & 0xcfff) == 0x4001) {
      alg_local = psa_rsa_verify((ppStack_40->data).rsa,hash_local._4_4_,
                                 (uint8_t *)hash_length_local,(size_t)signature_local,
                                 (uint8_t *)signature_length_local,(size_t)slot);
    }
    else if (((ppStack_40->attr).type & 0xcf00) == 0x4100) {
      if ((hash_local._4_4_ & 0xfffeff00) == 0x10060000) {
        alg_local = psa_ecdsa_verify((ppStack_40->data).ecp,(uint8_t *)hash_length_local,
                                     (size_t)signature_local,(uint8_t *)signature_length_local,
                                     (size_t)slot);
      }
      else {
        alg_local = 0xffffff79;
      }
    }
    else {
      alg_local = 0xffffff7a;
    }
  }
  return alg_local;
}

Assistant:

psa_status_t psa_verify_hash( psa_key_handle_t handle,
                              psa_algorithm_t alg,
                              const uint8_t *hash,
                              size_t hash_length,
                              const uint8_t *signature,
                              size_t signature_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    const psa_drv_se_t *drv;
    psa_drv_se_context_t *drv_context;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    status = psa_get_key_from_slot( handle, &slot, PSA_KEY_USAGE_VERIFY_HASH, alg );
    if( status != PSA_SUCCESS )
        return( status );

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_get_se_driver( slot->attr.lifetime, &drv, &drv_context ) )
    {
        if( drv->asymmetric == NULL ||
            drv->asymmetric->p_verify == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
        return( drv->asymmetric->p_verify( drv_context,
                                           slot->data.se.slot_number,
                                           alg,
                                           hash, hash_length,
                                           signature, signature_length ) );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
#if defined(MBEDTLS_RSA_C)
    if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
    {
        return( psa_rsa_verify( slot->data.rsa,
                                alg,
                                hash, hash_length,
                                signature, signature_length ) );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC( slot->attr.type ) )
    {
#if defined(MBEDTLS_ECDSA_C)
        if( PSA_ALG_IS_ECDSA( alg ) )
            return( psa_ecdsa_verify( slot->data.ecp,
                                      hash, hash_length,
                                      signature, signature_length ) );
        else
#endif /* defined(MBEDTLS_ECDSA_C) */
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }
    }
    else
#endif /* defined(MBEDTLS_ECP_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }
}